

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetSigningProvider
          (DescriptorScriptPubKeyMan *this,int32_t index,bool include_private)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  element_type *peVar3;
  int iVar4;
  FlatSigningProvider *pFVar5;
  mapped_type *pmVar6;
  byte in_CL;
  _Base_ptr p_Var7;
  uint uVar8;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  DescriptorScriptPubKeyMan *this_00;
  _Base_ptr p_Var9;
  long in_FS_OFFSET;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> out_keys;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  FlatSigningProvider *local_178;
  uint local_16c;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_168;
  undefined1 local_138 [8];
  undefined1 auStack_130 [8];
  pointer local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  size_t local_108;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_100;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_d0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_a0;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  local_70;
  long local_38;
  
  this_00 = (DescriptorScriptPubKeyMan *)CONCAT44(in_register_00000034,index);
  uVar8 = (uint)CONCAT71(in_register_00000011,include_private);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_16c = uVar8;
  pFVar5 = (FlatSigningProvider *)operator_new(0xf8);
  memset(pFVar5,0,0xf8);
  (pFVar5->super_SigningProvider)._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_00b409b0;
  p_Var1 = &(pFVar5->scripts)._M_t._M_impl.super__Rb_tree_header;
  (pFVar5->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pFVar5->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pFVar5->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pFVar5->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pFVar5->scripts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pFVar5->pubkeys)._M_t._M_impl.super__Rb_tree_header;
  (pFVar5->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pFVar5->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pFVar5->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pFVar5->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pFVar5->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pFVar5->origins)._M_t._M_impl.super__Rb_tree_header;
  (pFVar5->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pFVar5->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pFVar5->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pFVar5->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pFVar5->origins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pFVar5->keys)._M_t._M_impl.super__Rb_tree_header;
  (pFVar5->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pFVar5->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pFVar5->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pFVar5->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pFVar5->keys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pFVar5->tr_trees)._M_t._M_impl.super__Rb_tree_header;
  (pFVar5->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pFVar5->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pFVar5->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pFVar5->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pFVar5->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this_00->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = (this_00->m_map_signing_providers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
  ;
  p_Var7 = &p_Var1->_M_header;
  for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < (int)uVar8]
      ) {
    if ((int)uVar8 <= (int)p_Var9[1]._M_color) {
      p_Var7 = p_Var9;
    }
  }
  p_Var9 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
     (p_Var9 = p_Var7, (int)uVar8 < (int)p_Var7[1]._M_color)) {
    p_Var9 = &p_Var1->_M_header;
  }
  local_178 = pFVar5;
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
    local_138 = (undefined1  [8])0x0;
    auStack_130 = (undefined1  [8])0x0;
    local_128 = (pointer)0x0;
    peVar3 = (this_00->m_wallet_descriptor).descriptor.
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar4 = (*peVar3->_vptr_Descriptor[9])
                      (peVar3,CONCAT71(in_register_00000011,include_private) & 0xffffffff,
                       &(this_00->m_wallet_descriptor).cache,local_138,pFVar5);
    pFVar5 = local_178;
    if ((char)iVar4 == '\0') {
      (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
    }
    else {
      pmVar6 = std::
               map<int,_FlatSigningProvider,_std::less<int>,_std::allocator<std::pair<const_int,_FlatSigningProvider>_>_>
               ::operator[](&this_00->m_map_signing_providers,(key_type_conflict2 *)&local_16c);
      std::
      _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
      ::operator=(&(pmVar6->scripts)._M_t,&(pFVar5->scripts)._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::operator=(&(pmVar6->pubkeys)._M_t,&(pFVar5->pubkeys)._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::operator=(&(pmVar6->origins)._M_t,&(pFVar5->origins)._M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::operator=(&(pmVar6->keys)._M_t,&(pFVar5->keys)._M_t);
      std::
      _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
      ::operator=(&(pmVar6->tr_trees)._M_t,&(pFVar5->tr_trees)._M_t);
    }
    std::vector<CScript,_std::allocator<CScript>_>::~vector
              ((vector<CScript,_std::allocator<CScript>_> *)local_138);
    if ((char)iVar4 == '\0') goto LAB_004fbf27;
  }
  else {
    FlatSigningProvider::FlatSigningProvider
              ((FlatSigningProvider *)local_138,(FlatSigningProvider *)&p_Var9[1]._M_parent);
    FlatSigningProvider::Merge(pFVar5,(FlatSigningProvider *)local_138);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&local_70);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_a0);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&local_d0);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&local_100);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                 *)auStack_130);
  }
  iVar4 = (*(this_00->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0xf])(this_00);
  if (((byte)iVar4 & in_CL) == 1) {
    local_118 = (_Base_ptr)&local_128;
    local_138 = (undefined1  [8])&PTR__FlatSigningProvider_00b409b0;
    local_128 = (pointer)((ulong)local_128 & 0xffffffff00000000);
    local_120 = (_Base_ptr)0x0;
    local_108 = 0;
    local_100._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_100._M_impl.super__Rb_tree_header._M_header;
    local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d0._M_impl.super__Rb_tree_header._M_header;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &local_a0._M_impl.super__Rb_tree_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_70._M_impl.super__Rb_tree_header._M_header;
    local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_110 = local_118;
    local_100._M_impl.super__Rb_tree_header._M_header._M_right =
         local_100._M_impl.super__Rb_tree_header._M_header._M_left;
    local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    local_70._M_impl.super__Rb_tree_header._M_header._M_right =
         local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    GetKeys((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *
            )&local_168,this_00);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::clear(&local_a0);
    if (local_168._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var2 = &local_168._M_impl.super__Rb_tree_header;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_color =
           local_168._M_impl.super__Rb_tree_header._M_header._M_color;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_168._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
           local_168._M_impl.super__Rb_tree_header._M_header._M_left;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_168._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_168._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
      local_a0._M_impl.super__Rb_tree_header._M_node_count =
           local_168._M_impl.super__Rb_tree_header._M_node_count;
      local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_168._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_168._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_168);
    peVar3 = (this_00->m_wallet_descriptor).descriptor.
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_Descriptor[10])(peVar3,(ulong)local_16c,local_138,local_178);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&local_70);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_a0);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&local_d0);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&local_100);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                 *)auStack_130);
  }
  (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)local_178;
  local_178 = (FlatSigningProvider *)0x0;
LAB_004fbf27:
  if (local_178 != (FlatSigningProvider *)0x0) {
    std::default_delete<FlatSigningProvider>::operator()
              ((default_delete<FlatSigningProvider> *)&local_178,local_178);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
            )(__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<FlatSigningProvider> DescriptorScriptPubKeyMan::GetSigningProvider(int32_t index, bool include_private) const
{
    AssertLockHeld(cs_desc_man);

    std::unique_ptr<FlatSigningProvider> out_keys = std::make_unique<FlatSigningProvider>();

    // Fetch SigningProvider from cache to avoid re-deriving
    auto it = m_map_signing_providers.find(index);
    if (it != m_map_signing_providers.end()) {
        out_keys->Merge(FlatSigningProvider{it->second});
    } else {
        // Get the scripts, keys, and key origins for this script
        std::vector<CScript> scripts_temp;
        if (!m_wallet_descriptor.descriptor->ExpandFromCache(index, m_wallet_descriptor.cache, scripts_temp, *out_keys)) return nullptr;

        // Cache SigningProvider so we don't need to re-derive if we need this SigningProvider again
        m_map_signing_providers[index] = *out_keys;
    }

    if (HavePrivateKeys() && include_private) {
        FlatSigningProvider master_provider;
        master_provider.keys = GetKeys();
        m_wallet_descriptor.descriptor->ExpandPrivate(index, master_provider, *out_keys);
    }

    return out_keys;
}